

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::EpochMsFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  scalar_function_t timetz_func;
  LogicalType varargs;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 uVar1;
  undefined4 uVar2;
  function_statistics_t ts_stats;
  undefined1 null_handling;
  undefined8 bind_lambda;
  scalar_function_t local_3e8;
  scalar_function_t local_3c8;
  scalar_function_t local_3a8;
  LogicalType local_388;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_370;
  LogicalType local_358;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_340;
  code *local_328;
  undefined8 uStack_320;
  code *local_318;
  code *pcStack_310;
  scalar_function_t local_308;
  scalar_function_t local_2e8;
  LogicalType local_2c8;
  LogicalType local_2b0;
  LogicalType local_298;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ts_stats = (function_statistics_t)0x1b019a5;
  LogicalType::LogicalType(&local_298,BIGINT);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 0x14;
  local_3a8.super__Function_base._M_functor._8_8_ = 0;
  local_3a8.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_3a8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3a8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_2e8.super__Function_base._M_functor._8_8_ = 0;
  local_2e8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_2e8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_2e8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_308.super__Function_base._M_functor._8_8_ = 0;
  local_308.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::dtime_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_308._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_308.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  uStack_320 = 0;
  local_328 = ScalarFunction::
              UnaryFunction<duckdb::dtime_tz_t,long,duckdb::DatePart::EpochMillisOperator>;
  pcStack_310 = ::std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_318 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  timetz_func.super__Function_base._M_functor._8_8_ =
       DatePart::EpochMillisOperator::PropagateStatistics<duckdb::date_t>;
  timetz_func.super__Function_base._M_functor._M_unused._M_object = &local_328;
  timetz_func.super__Function_base._M_manager =
       DatePart::EpochMillisOperator::PropagateStatistics<duckdb::timestamp_t>;
  timetz_func._M_invoker._0_4_ = 0x1b96a3c;
  timetz_func._M_invoker._4_4_ = 0;
  GetGenericTimePartFunction
            (in_RDI,&local_298,(scalar_function_t *)&stack0xfffffffffffffbe8,&local_3a8,&local_2e8,
             &local_308,timetz_func,
             DatePart::EpochMillisOperator::PropagateStatistics<duckdb::dtime_tz_t>,ts_stats,
             DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::EpochMillisOperator>,
             (function_statistics_t)0x0);
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,3);
  }
  if (local_308.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_308.super__Function_base._M_manager)
              ((_Any_data *)&local_308,(_Any_data *)&local_308,__destroy_functor);
  }
  if (local_2e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2e8.super__Function_base._M_manager)
              ((_Any_data *)&local_2e8,(_Any_data *)&local_2e8,__destroy_functor);
  }
  if (local_3a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.super__Function_base._M_manager)
              ((_Any_data *)&local_3a8,(_Any_data *)&local_3a8,__destroy_functor);
  }
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffbe8,(_Any_data *)&stack0xfffffffffffffbe8,
               __destroy_functor);
  LogicalType::~LogicalType(&local_298);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbe8,TIMESTAMP_TZ);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffbe8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_340,__l,(allocator_type *)&local_3a8);
  LogicalType::LogicalType(&local_358,BIGINT);
  local_3c8.super__Function_base._M_functor._8_8_ = 0;
  local_3c8.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_3c8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3c8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_2b0,INVALID);
  uVar2 = 0;
  uVar1 = 0;
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_340,&local_358,&local_3c8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             DatePart::EpochMillisOperator::PropagateStatistics<duckdb::timestamp_t>,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_2b0),CONSISTENT,null_handling,
             (bind_lambda_function_t)bind_lambda);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_2b0);
  if (local_3c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3c8.super__Function_base._M_manager)
              ((_Any_data *)&local_3c8,(_Any_data *)&local_3c8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_358);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_340);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbe8);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbe8,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffffbe8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_370,__l_00,(allocator_type *)&local_3a8);
  LogicalType::LogicalType(&local_388,TIMESTAMP);
  local_3e8.super__Function_base._M_functor._8_8_ = 0;
  local_3e8.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::EpochMillisOperator::Inverse;
  local_3e8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3e8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_2c8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_2c8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = uVar1;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = uVar2;
  ScalarFunction::ScalarFunction
            (&local_280,(vector<duckdb::LogicalType,_true> *)&local_370,&local_388,&local_3e8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,null_handling,
             (bind_lambda_function_t)bind_lambda);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_2c8);
  if (local_3e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3e8.super__Function_base._M_manager)
              ((_Any_data *)&local_3e8,(_Any_data *)&local_3e8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_388);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_370);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbe8);
  return in_RDI;
}

Assistant:

ScalarFunctionSet EpochMsFun::GetFunctions() {
	using OP = DatePart::EpochMillisOperator;
	auto operator_set = GetTimePartFunction<OP>();

	//	TIMESTAMP WITH TIME ZONE has the same representation as TIMESTAMP so no need to defer to ICU
	auto tstz_func = DatePart::UnaryFunction<timestamp_t, int64_t, OP>;
	auto tstz_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BIGINT, tstz_func, nullptr, nullptr, tstz_stats));

	//	Legacy inverse BIGINT => TIMESTAMP
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::TIMESTAMP, DatePart::EpochMillisOperator::Inverse));

	return operator_set;
}